

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String * __thiscall
Bstrlib::String::findAndReplaceCaseless(String *this,char *find,char *repl,int pos)

{
  int iVar1;
  size_t sVar2;
  tagbstring u;
  tagbstring t;
  tagbstring local_50;
  tagbstring local_40;
  
  if (find != (char *)0x0 && repl != (char *)0x0) {
    local_40.data = (uchar *)find;
    sVar2 = strlen(find);
    local_40.slen = (int)sVar2;
    local_40.mlen = -1;
    local_50.data = (uchar *)repl;
    sVar2 = strlen(repl);
    local_50.slen = (int)sVar2;
    local_50.mlen = -1;
    iVar1 = bfindreplacecaseless(&this->super_tagbstring,&local_40,&local_50,pos);
    if (iVar1 == -1) {
      findAndReplaceCaseless();
    }
  }
  return this;
}

Assistant:

String & String::findAndReplaceCaseless(const char * find, const char * repl, int pos)
    {
        struct tagbstring t, u;
        if (NULL == repl || NULL == find) return *this;
        cstr2tbstr(t, find);
        cstr2tbstr(u, repl);
        if (BSTR_ERR == bfindreplacecaseless(this, (bstring) &t, (bstring) &u, pos)) bstringThrow("Failure in findreplacecaseless");
        return *this;
    }